

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCFuncPtr NULLC::FunctionRedirectPtr(NULLCRef r,NULLCArray *arr)

{
  NULLCFuncPtr NVar1;
  char *local_48;
  uint *funcs;
  NULLCArray *arr_local;
  NULLCFuncPtr ret;
  
  memset((void *)((long)&arr_local + 4),0,0xc);
  if (arr == (NULLCArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else if (r.typeID < arr->len) {
    if (*(int *)(arr->ptr + (ulong)r.typeID * 4) == 0) {
      local_48 = (char *)0x0;
    }
    else {
      local_48 = r.ptr;
    }
    stack0xffffffffffffffec = local_48;
    ret.context._0_4_ = *(uint *)(arr->ptr + (ulong)r.typeID * 4);
  }
  else {
    nullcThrowError("ERROR: type index is out of bounds of redirection table");
  }
  NVar1.id = (uint)ret.context;
  NVar1.context = stack0xffffffffffffffec;
  return NVar1;
}

Assistant:

NULLCFuncPtr NULLC::FunctionRedirectPtr(NULLCRef r, NULLCArray* arr)
{
	NULLCFuncPtr ret = { 0, 0 };

	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}

	unsigned int *funcs = (unsigned int*)arr->ptr;

	if(r.typeID >= arr->len)
	{
		nullcThrowError("ERROR: type index is out of bounds of redirection table");
		return ret;
	}

	ret.context = funcs[r.typeID] ? r.ptr : 0;
	ret.id = funcs[r.typeID];

	return ret;
}